

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiekeypath.h
# Opt level: O3

bool __thiscall LOTKeyPath::propagate(LOTKeyPath *this,string *key,uint32_t depth)

{
  pointer pbVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = std::__cxx11::string::compare((char *)key);
  bVar3 = true;
  if (iVar2 != 0) {
    pbVar1 = (this->mKeys).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((long)(this->mKeys).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U <= (ulong)depth)
    {
      iVar2 = std::__cxx11::string::compare((char *)(pbVar1 + depth));
      bVar3 = iVar2 == 0;
    }
  }
  return bVar3;
}

Assistant:

bool propagate(const std::string key, uint32_t depth)
    {
        return skip(key) ? true : (depth < size()) || (mKeys[depth] == "**");
    }